

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::ConvertArgOpndIfGeneratorFunction
          (Lowerer *this,Instr *instrArgIn,RegOpnd *generatorArgsPtrOpnd)

{
  bool bVar1;
  ArgSlot AVar2;
  JITTimeFunctionBody *this_00;
  Opnd *this_01;
  SymOpnd *pSVar3;
  StackSym *this_02;
  IndirOpnd *newSrc;
  IndirOpnd *indirOpnd;
  ArgSlot argIndex;
  StackSym *symParam;
  Opnd *srcOpnd;
  RegOpnd *generatorArgsPtrOpnd_local;
  Instr *instrArgIn_local;
  Lowerer *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar1 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar1) {
    this_01 = IR::Instr::UnlinkSrc1(instrArgIn);
    pSVar3 = IR::Opnd::AsSymOpnd(this_01);
    this_02 = Sym::AsStackSym(pSVar3->m_sym);
    AVar2 = StackSym::GetParamSlotNum(this_02);
    newSrc = IR::IndirOpnd::New(generatorArgsPtrOpnd,(AVar2 - 1) * 8,TyUint64,this->m_func,false);
    IR::Opnd::Free(this_01,this->m_func);
    IR::Instr::SetSrc1(instrArgIn,&newSrc->super_Opnd);
  }
  return;
}

Assistant:

void
Lowerer::ConvertArgOpndIfGeneratorFunction(IR::Instr *instrArgIn, IR::RegOpnd *generatorArgsPtrOpnd)
{
    if (this->m_func->GetJITFunctionBody()->IsCoroutine())
    {
        // Replace stack param operand with offset into arguments array held by
        // the generator object.
        IR::Opnd * srcOpnd = instrArgIn->UnlinkSrc1();
        StackSym * symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();
        Js::ArgSlot argIndex = symParam->GetParamSlotNum();

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorArgsPtrOpnd, (argIndex - 1) * MachPtr, TyMachPtr, this->m_func);

        srcOpnd->Free(this->m_func);
        instrArgIn->SetSrc1(indirOpnd);
    }
}